

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffeopn(fitsfile **fptr,char *name,int mode,char *extlist,int *hdutype,int *status)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *in_RCX;
  undefined8 *in_RDI;
  long in_R8;
  int *in_R9;
  int *unaff_retaddr;
  char *saveptr;
  char *textlist;
  char *ext;
  int gotext;
  int thdutype;
  int naxis;
  int hdunum;
  int *in_stack_000034b0;
  int in_stack_000034bc;
  char *in_stack_000034c0;
  fitsfile **in_stack_000034c8;
  int *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  fitsfile *in_stack_ffffffffffffffa8;
  char *local_50;
  int local_44;
  int local_3c;
  int *local_38;
  long local_30;
  char *local_28;
  undefined8 *local_10;
  int local_4;
  
  bVar1 = false;
  if (*in_R9 < 1) {
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_10 = in_RDI;
    iVar2 = ffopen(in_stack_000034c8,in_stack_000034c0,in_stack_000034bc,in_stack_000034b0);
    if (iVar2 < 1) {
      ffghdn((fitsfile *)*local_10,&local_3c);
      ffghdt(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if ((local_3c == 1) && (local_44 == 0)) {
        ffgidm(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      if (local_3c == 1) {
        if (local_28 != (char *)0x0) {
          bVar1 = false;
          sVar3 = strlen(local_28);
          in_stack_ffffffffffffffa8 = (fitsfile *)malloc(sVar3 + 1);
          if (in_stack_ffffffffffffffa8 == (fitsfile *)0x0) {
            *local_38 = 0x71;
            return *local_38;
          }
          strcpy((char *)in_stack_ffffffffffffffa8,local_28);
          local_50 = strtok((char *)in_stack_ffffffffffffffa8," ");
          while (local_50 != (char *)0x0) {
            ffmnhd(_naxis,thdutype,ext,textlist._4_4_,(int *)saveptr);
            if (*local_38 == 0) {
              bVar1 = true;
              break;
            }
            *local_38 = 0;
            local_50 = strtok((char *)0x0," ");
          }
          free(in_stack_ffffffffffffffa8);
        }
        if (!bVar1) {
          ffmahd((fitsfile *)ext,textlist._4_4_,(int *)saveptr,unaff_retaddr);
        }
      }
      if (local_30 != 0) {
        ffghdt(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      local_4 = *local_38;
    }
    else {
      local_4 = *local_38;
    }
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffeopn(fitsfile **fptr,      /* O - FITS file pointer                   */ 
           const char *name,     /* I - full name of file to open           */
           int mode,             /* I - 0 = open readonly; 1 = read/write   */
           char *extlist,        /* I - list of 'good' extensions to move to */
           int *hdutype,         /* O - type of extension that is moved to  */
           int *status)          /* IO - error status                       */
/*
  Open an existing FITS file with either readonly or read/write access. and
  if the primary array contains a null image (i.e., NAXIS = 0) then attempt to
  move to the first extension named in the extlist of extension names. If
  none are found, then simply move to the 2nd extension.
*/
{
    int hdunum, naxis = 0, thdutype, gotext=0;
    char *ext, *textlist;
    char *saveptr;
  
    if (*status > 0)
        return(*status);

    if (ffopen(fptr, name, mode, status) > 0)
        return(*status);

    fits_get_hdu_num(*fptr, &hdunum);
    fits_get_hdu_type(*fptr, &thdutype, status);
    if (hdunum == 1 && thdutype == IMAGE_HDU) {
      fits_get_img_dim(*fptr, &naxis, status);
    }

    /* We are in the "default" primary extension */
    /* look through the extension list */
    if( (hdunum == 1) && (naxis == 0) ){ 
      if( extlist ){
        gotext = 0;
	textlist = malloc(strlen(extlist) + 1);
	if (!textlist) {
	    *status = MEMORY_ALLOCATION;
	    return(*status);
	}

        strcpy(textlist, extlist);
        for(ext=(char *)ffstrtok(textlist, " ",&saveptr); ext != NULL; 
	    ext=(char *)ffstrtok(NULL," ",&saveptr)){
	    fits_movnam_hdu(*fptr, ANY_HDU, ext, 0, status);
	    if( *status == 0 ){
	      gotext = 1;
	      break;
	    } else {
	      *status = 0;
	    }
        }
        free(textlist);      
      }
      if( !gotext ){
        /* if all else fails, move to extension #2 and hope for the best */
        fits_movabs_hdu(*fptr, 2, &thdutype, status);
      }
    }
    if (hdutype) {
      fits_get_hdu_type(*fptr, hdutype, status);
    }
    return(*status);
}